

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t utf8TextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                       UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t local_60;
  int local_5c;
  int32_t destLength;
  int i;
  uint8_t *buf;
  int local_48;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_30;
  int32_t destCapacity_local;
  UChar *dest_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  _start32 = pErrorCode;
  pErrorCode_local._4_4_ = destCapacity;
  pUStack_30 = dest;
  dest_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((pErrorCode_local._4_4_ < 0) ||
       ((pUStack_30 == (UChar *)0x0 && (0 < pErrorCode_local._4_4_)))) {
      *_start32 = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local._4_4_ = 0;
    }
    else {
      limit32 = *(int *)(start_local + 0x78);
      local_48 = pinIndex(&limit_local,(long)limit32);
      buf._4_4_ = pinIndex((int64_t *)&dest_local,(long)limit32);
      if (buf._4_4_ < local_48) {
        *_start32 = U_INDEX_OUTOFBOUNDS_ERROR;
        ut_local._4_4_ = 0;
      }
      else {
        _destLength = *(long *)(start_local + 0x48);
        if ((long)local_48 < *(long *)(start_local + 0x10)) {
          local_5c = 0;
          for (; (((local_5c < 3 && ((*(byte *)(_destLength + local_48) & 0x80) != 0)) &&
                  (0x32 < (byte)(*(char *)(_destLength + local_48) + 0x3eU))) && (local_48 != 0));
              local_48 = local_48 + -1) {
            local_5c = local_5c + 1;
          }
        }
        if ((long)buf._4_4_ < *(long *)(start_local + 0x10)) {
          local_5c = 0;
          for (; ((local_5c < 3 && ((*(byte *)(_destLength + buf._4_4_) & 0x80) != 0)) &&
                 ((0x32 < (byte)(*(char *)(_destLength + buf._4_4_) + 0x3eU) && (buf._4_4_ != 0))));
              buf._4_4_ = buf._4_4_ + -1) {
            local_5c = local_5c + 1;
          }
        }
        local_60 = 0;
        utext_strFromUTF8(pUStack_30,pErrorCode_local._4_4_,&local_60,
                          (char *)(*(long *)(start_local + 0x48) + (long)local_48),
                          buf._4_4_ - local_48,_start32);
        utf8TextAccess((UText *)start_local,(long)buf._4_4_,'\x01');
        ut_local._4_4_ = local_60;
      }
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
utf8TextExtract(UText *ut,
                int64_t start, int64_t limit,
                UChar *dest, int32_t destCapacity,
                UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t  length  = ut->b;
    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);

    if(start32>limit32) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }


    // adjust the incoming indexes to land on code point boundaries if needed.
    //    adjust by no more than three, because that is the largest number of trail bytes
    //    in a well formed UTF8 character.
    const uint8_t *buf = (const uint8_t *)ut->context;
    int i;
    if (start32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[start32]) || U8_IS_LEAD(buf[start32]) || start32==0) {
                break;
            }
            start32--;
        }
    }

    if (limit32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[limit32]) || U8_IS_LEAD(buf[limit32]) || limit32==0) {
                break;
            }
            limit32--;
        }
    }

    // Do the actual extract.
    int32_t destLength=0;
    utext_strFromUTF8(dest, destCapacity, &destLength,
                    (const char *)ut->context+start32, limit32-start32,
                    pErrorCode);
    utf8TextAccess(ut, limit32, TRUE);
    return destLength;
}